

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

int main(void)

{
  undefined1 *puVar1;
  pid_t __pid;
  int iVar2;
  uint uVar3;
  __pid_t _Var4;
  char *__format;
  _Bool *err;
  undefined1 local_438 [8];
  tester_mq_msg tester_msg;
  int wait_ret;
  
  main_pid = getpid();
  iVar2 = sigemptyset((sigset_t *)&err_action.sa_mask);
  if (iVar2 == -1) {
LAB_0010167b:
    ::err = true;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                  ,"setup_sig_handlers");
  }
  else {
    err_action.sa_flags = 0;
    err_action.__sigaction_handler.sa_handler = sig_err_handler;
    iVar2 = sigaction(2,(sigaction *)&err_action,(sigaction *)0x0);
    if (iVar2 == -1) goto LAB_0010167b;
    iVar2 = sigaction(0xf,(sigaction *)&err_action,(sigaction *)0x0);
    if (iVar2 == -1) goto LAB_0010167b;
    iVar2 = sigemptyset((sigset_t *)&snt_success_action.sa_mask);
    if (iVar2 == -1) goto LAB_0010167b;
    snt_success_action.sa_flags = 0x10000000;
    snt_success_action.__sigaction_handler.sa_handler = sig_snt_success_handler;
    iVar2 = __libc_current_sigrtmin();
    iVar2 = sigaction(iVar2 + 1,(sigaction *)&snt_success_action,(sigaction *)0x0);
    if (iVar2 == -1) goto LAB_0010167b;
    iVar2 = sigemptyset((sigset_t *)&rcd_complete_action.sa_mask);
    if (iVar2 == -1) goto LAB_0010167b;
    rcd_complete_action.sa_flags = 0;
    rcd_complete_action.__sigaction_handler.sa_handler = sig_rcd_complete_handler;
    iVar2 = __libc_current_sigrtmin();
    iVar2 = sigaction(iVar2 + 2,(sigaction *)&snt_success_action,(sigaction *)0x0);
    if (iVar2 == -1) goto LAB_0010167b;
  }
  if (::err == true) {
LAB_001018fb:
    main_cold_10();
LAB_00101900:
    main_cold_9();
LAB_00101905:
    main_cold_7();
LAB_0010190a:
    main_cold_6();
  }
  else {
    tester_mq_get_name_from_pid(main_pid,tester_mq_name);
    tester_mq = tester_mq_start(true,tester_mq_name,&::err);
    if (::err == true) goto LAB_00101900;
    sender_pid = fork();
    if (sender_pid != -1) {
      if (sender_pid == 0) {
        tester_mq_finish(false,tester_mq,(char *)0x0,&::err);
        if (::err != true) goto LAB_00101914;
        main_cold_4();
        goto LAB_00101723;
      }
LAB_00101730:
      close(0);
      printf("PID: %d\n",(ulong)(uint)main_pid);
      puVar1 = (undefined1 *)((long)&tester_msg.total_processed + 2);
      while( true ) {
        if ((rcd_completed == '\x01') && (expected_rcd <= comm_summary.rcd)) {
          tester_mq_finish(true,tester_mq,tester_mq_name,&::err);
          if (::err == true) goto LAB_00101905;
          tester_msg._1020_4_ = 0;
          _Var4 = wait(&tester_msg.field_0x3fc);
          if ((_Var4 == -1) || (tester_msg._1020_4_ != 0)) {
            ::err = true;
            log_formatted("Fail in %s, function: %s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                          ,"collect_sender");
          }
          if (::err != true) {
            print_comm_summary(&comm_summary,false);
            return 0;
          }
          goto LAB_0010190a;
        }
        tester_mq_receive(tester_mq,(tester_mq_msg *)local_438,&::err);
        if (::err == true) break;
        if ((char)tester_msg.total_processed == '\0') {
          comm_summary.rcd = comm_summary.rcd + 1;
          uVar3 = getpid();
          log_formatted("%d RCD: %s, total rcd=%d",(ulong)uVar3,puVar1,comm_summary.rcd);
          __format = "%s N\n";
          if (tester_msg.total_processed._1_1_ == '\x01') {
            comm_summary.acc = comm_summary.acc + 1;
            __format = "%s A\n";
          }
          printf(__format,puVar1);
        }
        if (local_438[0] == true) {
          uVar3 = getpid();
          log_formatted("%d RCD: COMPLETED",(ulong)uVar3);
          __pid = sender_pid;
          iVar2 = __libc_current_sigrtmin();
          kill(__pid,iVar2 + 2);
          expected_rcd = tester_msg._0_8_;
          log_formatted("Expecting to wait for (%d-%d)=%d mode responses...",tester_msg._0_8_,
                        comm_summary.rcd,tester_msg._0_8_ - comm_summary.rcd);
          rcd_completed = '\x01';
        }
      }
      main_cold_8();
      goto LAB_001018fb;
    }
LAB_00101723:
    if (::err != true) goto LAB_00101730;
  }
  main_cold_5();
LAB_00101914:
  err = (_Bool *)0x0;
  validator_mq = validator_mq_start(false,&::err);
  if (::err == true) {
    main_cold_3();
  }
  run_sender(err);
  if (::err == true) {
    main_cold_2();
  }
  validator_mq_finish(false,validator_mq,&::err);
  if (::err == true) {
    main_cold_1();
  }
  exit(0);
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");

    // setup queues
    tester_mq_get_name_from_pid(main_pid, tester_mq_name);
    tester_mq = tester_mq_start(true, tester_mq_name, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start tester mq");

    // create process for processing and sending words
    async_spawn_sender();
    close(0); // prevent any possible data races in input

    printf("PID: %d\n", main_pid);
    // process validator responses
    tester_mq_msg tester_msg;
    while(!rcd_completed || comm_summary.rcd < expected_rcd) {
        tester_mq_receive(tester_mq, &tester_msg, &err);
        HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to receive message from tester mq");

        process_msg(&tester_msg);
    }
    tester_mq_finish(true, tester_mq, tester_mq_name, &err);
    HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to finish tester mq in main process");

    // clean up
    collect_sender(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Unexpected fail while collecting message sender");
    print_comm_summary(&comm_summary, false);
    return 0;
}